

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UBool __thiscall
icu_63::ModulusSubstitution::doParse
          (ModulusSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool lenientParse,
          uint32_t nonNumericalExecutedRuleMask,Formattable *result)

{
  int32_t iVar1;
  double dVar2;
  double d;
  double tempResult;
  Formattable *pFStack_48;
  UErrorCode status;
  Formattable *result_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  UBool lenientParse_local;
  double upperBound_local;
  double baseValue_local;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  ModulusSubstitution *this_local;
  
  pFStack_48 = result;
  result_local._0_4_ = nonNumericalExecutedRuleMask;
  result_local._7_1_ = lenientParse;
  _nonNumericalExecutedRuleMask_local = upperBound;
  upperBound_local = baseValue;
  baseValue_local = (double)parsePosition;
  parsePosition_local = (ParsePosition *)text;
  text_local = (UnicodeString *)this;
  if (this->ruleToUse == (NFRule *)0x0) {
    this_local._7_1_ =
         NFSubstitution::doParse
                   (&this->super_NFSubstitution,text,parsePosition,baseValue,upperBound,lenientParse
                    ,nonNumericalExecutedRuleMask,result);
  }
  else {
    NFRule::doParse(this->ruleToUse,text,parsePosition,'\0',upperBound,nonNumericalExecutedRuleMask,
                    result);
    iVar1 = ParsePosition::getIndex((ParsePosition *)baseValue_local);
    if (iVar1 != 0) {
      tempResult._4_4_ = 0;
      dVar2 = Formattable::getDouble(pFStack_48,(UErrorCode *)((long)&tempResult + 4));
      (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar2,upperBound_local);
      Formattable::setDouble(pFStack_48,d);
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
ModulusSubstitution::doParse(const UnicodeString& text,
                             ParsePosition& parsePosition,
                             double baseValue,
                             double upperBound,
                             UBool lenientParse,
                             uint32_t nonNumericalExecutedRuleMask,
                             Formattable& result) const
{
    // if this isn't a >>> substitution, we can just use the
    // inherited parse() routine to do the parsing
    if (ruleToUse == NULL) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, upperBound, lenientParse, nonNumericalExecutedRuleMask, result);

        // but if it IS a >>> substitution, we have to do it here: we
        // use the specific rule's doParse() method, and then we have to
        // do some of the other work of NFRuleSet.parse()
    } else {
        ruleToUse->doParse(text, parsePosition, FALSE, upperBound, nonNumericalExecutedRuleMask, result);

        if (parsePosition.getIndex() != 0) {
            UErrorCode status = U_ZERO_ERROR;
            double tempResult = result.getDouble(status);
            tempResult = composeRuleValue(tempResult, baseValue);
            result.setDouble(tempResult);
        }

        return TRUE;
    }
}